

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
RCONIRCCommand::trigger
          (RCONIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  string local_50;
  
  pcVar4 = channel._M_str;
  sVar5 = channel._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,nick._M_str,0x2f,"Error: Too Few Parameters. Syntax: rcon <input>"
              );
    return;
  }
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar5,pcVar4);
  if (lVar2 != 0) {
    uVar3 = RenX::getCore();
    uVar1 = Jupiter::IRC::Client::Channel::getType();
    lVar2 = RenX::Core::send(uVar3,uVar1,parameters._M_len,parameters._M_str);
    if (lVar2 == 0) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar5,pcVar4,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
      return;
    }
    string_printf_abi_cxx11_(&local_50,"Command sent to %u servers.",lVar2);
    Jupiter::IRC::Client::sendMessage
              (source,sVar5,pcVar4,local_50._M_string_length,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void RCONIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: rcon <input>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	size_t server_count = RenX::getCore()->send(chan->getType(), parameters);
	if (server_count > 0) {
		source->sendMessage(channel, string_printf("Command sent to %u servers.", server_count));
	}
	else {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}